

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgCalcScc(Abc_TgMan_t *pMan,int *pOut,int fSort)

{
  long lVar1;
  char cVar2;
  int i;
  word *pTruth;
  word wVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  TiedGroup *pTVar8;
  byte bVar9;
  int *piVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int local_58 [10];
  
  pTruth = pMan->pTruth;
  iVar4 = pMan->nVars;
  lVar12 = (long)iVar4;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  uVar13 = 0;
  memset(pOut,0,lVar12 * 4);
  if (lVar12 < 7) {
    Abc_TtNormalizeSmallTruth(pTruth,iVar4);
    Abc_TtSccInCofs6(*pTruth,iVar4,0,pOut);
  }
  else {
    bVar9 = (char)iVar4 - 6U & 0x1f;
    uVar6 = (ulong)(uint)(1 << bVar9);
    if (1 << bVar9 < 1) {
      uVar6 = uVar13;
    }
    for (; uVar13 != uVar6; uVar13 = uVar13 + 1) {
      wVar3 = pTruth[uVar13];
      iVar4 = Abc_TtBitCount16((uint)uVar13);
      Abc_TtSccInCofs6(wVar3,6,iVar4,pOut);
      iVar4 = 6;
      for (lVar7 = 0; lVar12 + -6 != lVar7; lVar7 = lVar7 + 1) {
        if (((uint)uVar13 >> (iVar4 - 6U & 0x1f) & 1) == 0) {
          wVar3 = pTruth[uVar13];
          i = local_58[lVar7];
          iVar5 = Abc_TtBitCount16(i);
          iVar5 = Abc_TtScc6(wVar3,iVar5);
          pOut[lVar7 + 6] = pOut[lVar7 + 6] + iVar5;
          local_58[lVar7] = i + 1;
        }
        iVar4 = iVar4 + 1;
      }
    }
  }
  lVar12 = 0;
  lVar7 = 0;
  do {
    if (pMan->nGVars <= lVar12) {
      if (fSort != 0) {
        for (pTVar8 = pMan->pGroup; pTVar8 < pMan->pGroup + pMan->nGroups; pTVar8 = pTVar8 + 1) {
          lVar7 = (long)pTVar8->iStart;
          cVar2 = pTVar8->nGVars;
          piVar10 = pOut + lVar7;
          piVar11 = piVar10;
          lVar12 = lVar7;
          while (lVar1 = lVar12 + 1, lVar1 < cVar2 + lVar7) {
            iVar4 = pOut[lVar1];
            for (lVar14 = 1; (lVar7 < lVar12 + lVar14 && (iVar4 < piVar10[lVar14 + -1]));
                lVar14 = lVar14 + -1) {
              piVar10[lVar14] = piVar10[lVar14 + -1];
            }
            piVar11[lVar14] = iVar4;
            piVar11 = piVar11 + 1;
            piVar10 = piVar10 + 1;
            lVar12 = lVar1;
          }
        }
      }
      return;
    }
    lVar7 = (long)(int)lVar7;
    iVar4 = pOut[lVar7];
    pOut[lVar12] = iVar4;
    bVar9 = pMan->pPerm[lVar12];
    while (-1 < (char)bVar9) {
      bVar9 = pMan->symLink[bVar9];
      if ((-1 < (char)bVar9) && (iVar4 != pOut[lVar7 + 1])) {
        __assert_fail("pMan->symLink[k] < 0 || pOut[j] == pOut[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                      ,0x8fc,"void Abc_TgCalcScc(Abc_TgMan_t *, int *, int)");
      }
      lVar7 = lVar7 + 1;
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

static void Abc_TgCalcScc(Abc_TgMan_t * pMan, int * pOut, int fSort)
{
    int i, j, k;
    TiedGroup * pGrp;

    Abc_TtSccInCofs(pMan->pTruth, pMan->nVars, pOut);

    for (i = j = 0; j < pMan->nGVars; j++)
    {
        pOut[j] = pOut[i];
        for (k = pMan->pPerm[j]; k >= 0; k = pMan->symLink[k])
        {
            i++;
            assert(pMan->symLink[k] < 0 || pOut[j] == pOut[i]);
        }
    }
    if (!fSort) return;

    for (pGrp = pMan->pGroup; pGrp < pMan->pGroup + pMan->nGroups; pGrp++)
    {
        int vb = pGrp->iStart, ve = vb + pGrp->nGVars;
        for (i = vb + 1; i < ve; i++)
        {
            int a = pOut[i];
            for (j = i; j > vb && pOut[j - 1] > a; j--)
                pOut[j] = pOut[j - 1];
            pOut[j] = a;
        }
    }
}